

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS ref_metric_synchronize(REF_GRID to_grid)

{
  REF_INTERP ref_interp_00;
  uint uVar1;
  int local_58;
  int local_54;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL report_interp_error;
  REF_DBL tol;
  REF_DBL max_error;
  REF_INT node;
  REF_MPI ref_mpi;
  REF_INTERP ref_interp;
  REF_GRID to_grid_local;
  
  ref_interp_00 = to_grid->interp;
  if (ref_interp_00 == (REF_INTERP)0x0) {
    return 0;
  }
  if (ref_interp_00->ref_mpi->n < 2) {
    for (max_error._4_4_ = 0; max_error._4_4_ < to_grid->node->max;
        max_error._4_4_ = max_error._4_4_ + 1) {
      if (((-1 < max_error._4_4_) && (max_error._4_4_ < to_grid->node->max)) &&
         (-1 < to_grid->node->global[max_error._4_4_])) {
        if ((max_error._4_4_ < 0) || (to_grid->cell[3]->ref_adj->nnode <= max_error._4_4_)) {
          local_54 = -1;
        }
        else {
          local_54 = to_grid->cell[3]->ref_adj->first[max_error._4_4_];
        }
        if (local_54 != -1) {
          if ((max_error._4_4_ < 0) || (to_grid->cell[8]->ref_adj->nnode <= max_error._4_4_)) {
            local_58 = -1;
          }
          else {
            local_58 = to_grid->cell[8]->ref_adj->first[max_error._4_4_];
          }
          if ((local_58 != -1) && (ref_interp_00->cell[max_error._4_4_] == -1)) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x2c8,"ref_metric_synchronize","should be located");
            return 1;
          }
        }
      }
    }
  }
  else {
    uVar1 = ref_interp_locate_warm(ref_interp_00);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x2c1,"ref_metric_synchronize",(ulong)uVar1,"map from existing");
      return uVar1;
    }
    uVar1 = ref_metric_interpolate(ref_interp_00);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x2c2,"ref_metric_synchronize",(ulong)uVar1,"interp");
      return uVar1;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_metric_synchronize(REF_GRID to_grid) {
  REF_INTERP ref_interp = ref_grid_interp(to_grid);
  REF_MPI ref_mpi;
  REF_INT node;
  REF_DBL max_error, tol = 1.0e-8;
  REF_BOOL report_interp_error = REF_FALSE;

  if (NULL == ref_interp) return REF_SUCCESS;

  ref_mpi = ref_interp_mpi(ref_interp);

  if (ref_mpi_para(ref_mpi)) {
    /* parallel can miss on partition boundaries, refresh interp */
    RSS(ref_interp_locate_warm(ref_interp), "map from existing");
    RSS(ref_metric_interpolate(ref_interp), "interp");
  } else {
    /* sequential should always localized unless mixed, assert */
    each_ref_node_valid_node(ref_grid_node(to_grid), node) {
      if (!ref_cell_node_empty(ref_grid_tri(to_grid), node) &&
          !ref_cell_node_empty(ref_grid_tet(to_grid), node)) {
        RUS(REF_EMPTY, ref_interp_cell(ref_interp, node), "should be located");
      }
    }
  }

  if (report_interp_error) {
    RSS(ref_interp_max_error(ref_interp, &max_error), "err");
    if (max_error > tol && ref_mpi_once(ref_mpi)) {
      printf("warning: %e max_error greater than %e tol\n", max_error, tol);
    }
  }

  return REF_SUCCESS;
}